

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void amqp_dump(void *buffer,size_t len)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  size_t count;
  int numinrow;
  int oldchs [16];
  int chs [16];
  
  oldchs[0xc] = 0;
  oldchs[0xd] = 0;
  oldchs[0xe] = 0;
  oldchs[0xf] = 0;
  oldchs[8] = 0;
  oldchs[9] = 0;
  oldchs[10] = 0;
  oldchs[0xb] = 0;
  oldchs[4] = 0;
  oldchs[5] = 0;
  oldchs[6] = 0;
  oldchs[7] = 0;
  oldchs[0] = 0;
  oldchs[1] = 0;
  oldchs[2] = 0;
  oldchs[3] = 0;
  numinrow = 0;
  bVar4 = false;
  count = 0;
  do {
    if (count == len) {
      dump_row(len,numinrow,chs);
      if (numinrow != 0) {
        printf("%08lX:\n",len);
        return;
      }
      return;
    }
    bVar3 = *(byte *)((long)buffer + count);
    if (numinrow == 0x10) {
      lVar6 = 0;
      do {
        if (lVar6 == 0x10) {
          bVar5 = !bVar4;
          bVar4 = true;
          if (bVar5) {
            puts("          .. .. .. .. .. .. .. .. : .. .. .. .. .. .. .. ..");
          }
          goto LAB_00101998;
        }
        piVar1 = oldchs + lVar6;
        piVar2 = chs + lVar6;
        lVar6 = lVar6 + 1;
      } while (*piVar1 == *piVar2);
      dump_row(count,0x10,chs);
      bVar4 = false;
LAB_00101998:
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        oldchs[lVar6] = chs[lVar6];
      }
      numinrow = 0;
    }
    count = count + 1;
    lVar6 = (long)numinrow;
    numinrow = numinrow + 1;
    chs[lVar6] = (uint)bVar3;
  } while( true );
}

Assistant:

void amqp_dump(void const *buffer, size_t len)
{
  unsigned char *buf = (unsigned char *) buffer;
  long count = 0;
  int numinrow = 0;
  int chs[16];
  int oldchs[16] = {0};
  int showed_dots = 0;
  size_t i;

  for (i = 0; i < len; i++) {
    int ch = buf[i];

    if (numinrow == 16) {
      int i;

      if (rows_eq(oldchs, chs)) {
        if (!showed_dots) {
          showed_dots = 1;
          printf("          .. .. .. .. .. .. .. .. : .. .. .. .. .. .. .. ..\n");
        }
      } else {
        showed_dots = 0;
        dump_row(count, numinrow, chs);
      }

      for (i=0; i<16; i++) {
        oldchs[i] = chs[i];
      }

      numinrow = 0;
    }

    count++;
    chs[numinrow++] = ch;
  }

  dump_row(count, numinrow, chs);

  if (numinrow != 0) {
    printf("%08lX:\n", count);
  }
}